

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O0

float If_ManDelayMax(If_Man_t *p,int fSeq)

{
  int iVar1;
  If_Obj_t *pIVar2;
  If_Obj_t *pIVar3;
  float fVar4;
  int local_28;
  float local_24;
  int i;
  float DelayBest;
  If_Obj_t *pObj;
  int fSeq_local;
  If_Man_t *p_local;
  
  if ((p->pPars->fLatchPaths != 0) && ((p->pPars->nLatchesCi == 0 || (p->pPars->nLatchesCo == 0))))
  {
    Abc_Print(0,"Delay optimization of latch path is not performed because there is no latches.\n");
    p->pPars->fLatchPaths = 0;
  }
  local_24 = -1e+20;
  if (fSeq == 0) {
    if (p->pPars->fLatchPaths == 0) {
      for (local_28 = 0; iVar1 = Vec_PtrSize(p->vCos), local_28 < iVar1; local_28 = local_28 + 1) {
        pIVar2 = (If_Obj_t *)Vec_PtrEntry(p->vCos,local_28);
        pIVar3 = If_ObjFanin0(pIVar2);
        fVar4 = If_ObjArrTime(pIVar3);
        if (local_24 < fVar4) {
          pIVar2 = If_ObjFanin0(pIVar2);
          local_24 = If_ObjArrTime(pIVar2);
        }
      }
    }
    else {
      local_28 = If_ManCoNum(p);
      for (local_28 = local_28 - p->pPars->nLatchesCo; iVar1 = Vec_PtrSize(p->vCos),
          local_28 < iVar1; local_28 = local_28 + 1) {
        pIVar2 = (If_Obj_t *)Vec_PtrEntry(p->vCos,local_28);
        pIVar3 = If_ObjFanin0(pIVar2);
        fVar4 = If_ObjArrTime(pIVar3);
        if (local_24 < fVar4) {
          pIVar2 = If_ObjFanin0(pIVar2);
          local_24 = If_ObjArrTime(pIVar2);
        }
      }
    }
  }
  else {
    if (p->pPars->nLatchesCi < 1) {
      __assert_fail("p->pPars->nLatchesCi > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTime.c"
                    ,0x114,"float If_ManDelayMax(If_Man_t *, int)");
    }
    for (local_28 = p->pPars->nLatchesCoBox; iVar1 = If_ManCoNum(p),
        local_28 < iVar1 - p->pPars->nLatchesCo; local_28 = local_28 + 1) {
      pIVar2 = (If_Obj_t *)Vec_PtrEntry(p->vCos,local_28);
      pIVar3 = If_ObjFanin0(pIVar2);
      fVar4 = If_ObjArrTime(pIVar3);
      if (local_24 < fVar4) {
        pIVar2 = If_ObjFanin0(pIVar2);
        local_24 = If_ObjArrTime(pIVar2);
      }
    }
  }
  return local_24;
}

Assistant:

float If_ManDelayMax( If_Man_t * p, int fSeq )
{
    If_Obj_t * pObj;
    float DelayBest;
    int i;
    if ( p->pPars->fLatchPaths && (p->pPars->nLatchesCi == 0 || p->pPars->nLatchesCo == 0) )
    {
        Abc_Print( 0, "Delay optimization of latch path is not performed because there is no latches.\n" );
        p->pPars->fLatchPaths = 0;
    }
    DelayBest = -IF_FLOAT_LARGE;
    if ( fSeq )
    {
        assert( p->pPars->nLatchesCi > 0 );
        If_ManForEachPo( p, pObj, i )
            if ( DelayBest < If_ObjArrTime(If_ObjFanin0(pObj)) )
                 DelayBest = If_ObjArrTime(If_ObjFanin0(pObj));
    }
    else if ( p->pPars->fLatchPaths )
    {
        If_ManForEachLatchInput( p, pObj, i )
            if ( DelayBest < If_ObjArrTime(If_ObjFanin0(pObj)) )
                 DelayBest = If_ObjArrTime(If_ObjFanin0(pObj));
    }
    else 
    {
        If_ManForEachCo( p, pObj, i )
            if ( DelayBest < If_ObjArrTime(If_ObjFanin0(pObj)) )
                 DelayBest = If_ObjArrTime(If_ObjFanin0(pObj));
    }
    return DelayBest;
}